

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleFunctionalTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureFunctionalTestsSampleMaskingTexturesTest::iterate
          (MultisampleTextureFunctionalTestsSampleMaskingTexturesTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  float *pfVar8;
  float fVar9;
  GLfloat result;
  GLfloat *mapped_bo;
  int n_bit;
  GLint mask_bits_to_check;
  int local_a8;
  GLenum local_a4;
  GLint internalformat_max_samples;
  GLenum internalformat;
  uint n_internalformat;
  uint local_8c;
  GLenum *pGStack_88;
  uint n_internalformats;
  GLenum *internalformats;
  GLenum attachment;
  uint n_iteration;
  uint n_depth_internalformats;
  uint n_signed_color_internalformats;
  uint n_unsigned_color_internalformats;
  uint n_normalized_color_internalformats;
  GLenum depth_internalformats [1];
  GLenum signed_color_internalformats [2];
  GLenum unsigned_color_internalformats [2];
  GLenum normalized_color_internalformats [3];
  GLuint n_bit_on_location;
  GLuint n_bits_location;
  GLchar *vs_verify_varying_name;
  GLchar *vs_verify_body;
  GLchar *vs_draw_body;
  GLchar *fs_draw_body;
  long lStack_18;
  GLfloat epsilon;
  Functions *gl;
  MultisampleTextureFunctionalTestsSampleMaskingTexturesTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  fs_draw_body._4_4_ = 0x3727c5ac;
  vs_draw_body = 
  "#version 310 es\n\nout vec4 out_color;\n\nvoid main()\n{\n    out_color = vec4(1, 1, 1, 1);\n}\n"
  ;
  vs_verify_body =
       "#version 310 es\n\nvoid main()\n{\n    switch (gl_VertexID)\n    {\n        case 0: gl_Position = vec4(-1,  1, 0, 1); break;\n        case 1: gl_Position = vec4( 1,  1, 0, 1); break;\n        case 2: gl_Position = vec4( 1, -1, 0, 1); break;\n        case 3: gl_Position = vec4(-1, -1, 0, 1); break;\n    }\n}\n"
  ;
  vs_verify_varying_name =
       "#version 310 es\n\nprecision highp float;\n\nuniform uint              n_bit_on;\nuniform uint              n_bits;\nuniform highp sampler2DMS sampler;\n\nout float result;\n\nvoid main()\n{\n    vec4 one  = vec4(1);\n    vec4 zero = vec4(0);\n\n    result = 1.0;\n\n    for (uint n_current_bit = 0u; n_current_bit < n_bits; n_current_bit++)\n    {\n        vec4 value = texelFetch(sampler, ivec2(0), int(n_current_bit));\n\n        if (n_bit_on == n_current_bit)\n        {\n            if (any(notEqual(value, one)))\n            {\n                result = 0.0;\n            }\n        }\n        else\n        {\n            if (any(notEqual(value, zero)))\n            {\n                result = 0.0;\n            }\n        }\n    }\n}\n"
  ;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)this->vs_draw_id,
             "#version 310 es\n\nvoid main()\n{\n    switch (gl_VertexID)\n    {\n        case 0: gl_Position = vec4(-1,  1, 0, 1); break;\n        case 1: gl_Position = vec4( 1,  1, 0, 1); break;\n        case 2: gl_Position = vec4( 1, -1, 0, 1); break;\n        case 3: gl_Position = vec4(-1, -1, 0, 1); break;\n    }\n}\n"
            );
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)this->vs_verify_id,vs_verify_varying_name);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)this->fs_draw_id,vs_draw_body);
  (**(code **)(lStack_18 + 0x10))(this->po_draw_id,this->vs_draw_id);
  (**(code **)(lStack_18 + 0x10))(this->po_draw_id,this->fs_draw_id);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Could not configure po_draw_id program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x82a);
  (**(code **)(lStack_18 + 0x10))(this->po_verify_id,this->vs_verify_id);
  (**(code **)(lStack_18 + 0x10))(this->po_verify_id,this->fs_draw_id);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Could not configure po_verify_id program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x830);
  _n_bit_on_location = "result";
  (**(code **)(lStack_18 + 0x14c8))(this->po_verify_id,1,&n_bit_on_location,0x8c8d);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,(ulong)this->po_draw_id);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,(ulong)this->po_verify_id);
  uVar3 = (**(code **)(lStack_18 + 0xb48))(this->po_verify_id,"n_bits");
  uVar4 = (**(code **)(lStack_18 + 0xb48))(this->po_verify_id,"n_bit_on");
  (**(code **)(lStack_18 + 0xb8))(0x9100,this->to_2d_multisample_id);
  (**(code **)(lStack_18 + 0x78))(0x8ca9,this->fbo_id);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Could not set up a framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x847);
  (**(code **)(lStack_18 + 0x40))(0x8c8e,this->bo_id);
  (**(code **)(lStack_18 + 0x48))(0x8c8e,0,this->bo_id);
  (**(code **)(lStack_18 + 0xd0))(0x8e22,this->tfo_id);
  (**(code **)(lStack_18 + 0x150))(0x8c8e,4,0,0x88e4);
  (**(code **)(lStack_18 + 0x6a0))(0x8ca9,0x8ce0,0x9100,this->to_2d_multisample_id,0);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"Could not set up zeroth color attachment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x859);
  (**(code **)(lStack_18 + 0x5e0))(0x8e51);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glEnable(GL_SAMPLE_MASK) call generated an unexpected error",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x85e);
  unsigned_color_internalformats[0] = 0x8229;
  unsigned_color_internalformats[1] = 0x8d62;
  signed_color_internalformats[0] = 0x8d70;
  signed_color_internalformats[1] = 0x823a;
  _n_normalized_color_internalformats = 0x823900008d82;
  n_unsigned_color_internalformats = 0x8cac;
  n_signed_color_internalformats = 3;
  n_depth_internalformats = 2;
  n_iteration = 2;
  attachment = 1;
  internalformats._4_4_ = 0;
  do {
    if (3 < internalformats._4_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    internalformats._0_4_ = 0;
    pGStack_88 = (GLenum *)0x0;
    local_8c = 0;
    switch(internalformats._4_4_) {
    case 0:
      internalformats._0_4_ = 0x8ce0;
      pGStack_88 = unsigned_color_internalformats;
      local_8c = 3;
      break;
    case 1:
      internalformats._0_4_ = 0x8ce0;
      pGStack_88 = signed_color_internalformats;
      local_8c = 2;
      break;
    case 2:
      internalformats._0_4_ = 0x8ce0;
      pGStack_88 = &n_normalized_color_internalformats;
      local_8c = 2;
      break;
    case 3:
      internalformats._0_4_ = 0x8d00;
      pGStack_88 = &n_unsigned_color_internalformats;
      local_8c = 1;
      break;
    default:
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Unrecognized iteration index",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                 ,0x89b);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (internalformat_max_samples = 0; (uint)internalformat_max_samples < local_8c;
        internalformat_max_samples = internalformat_max_samples + 1) {
      local_a4 = pGStack_88[(uint)internalformat_max_samples];
      local_a8 = 0;
      (**(code **)(lStack_18 + 0x880))(0x9100,local_a4,0x80a9,1,&local_a8);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"glGetInternalformativ() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0x8aa);
      if (0x20 < local_a8) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&n_bit,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&n_bit,
                            (char (*) [51])"The test case checks only first 32 samples out of ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a8);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [59])
                                   " reported by GL_SAMPLES reported by getInternalformativ() ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])0x2a69893);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_a4);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_bit);
      }
      iVar1 = de::min<int>(local_a8,0x20);
      if (this->to_2d_multisample_id == 0) {
        (**(code **)(lStack_18 + 0x6f8))(1,&this->to_2d_multisample_id);
        dVar2 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar2,"glGenTextures() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0x8bd);
        if (this->to_2d_multisample_id == 0) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Texture object has not been generated properly",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0x8c1);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(lStack_18 + 0xb8))(0x9100,this->to_2d_multisample_id);
        (**(code **)(lStack_18 + 0x6a0))
                  (0x8ca9,internalformats._0_4_,0x9100,this->to_2d_multisample_id,0);
        dVar2 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar2,"Could not set up attachment",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0x8cb);
      }
      (**(code **)(lStack_18 + 0x1390))(0x9100,local_a8,local_a4,1,1);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"glTexStorage2DMultisample() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0x8d5);
      for (mapped_bo._0_4_ = 0; (int)mapped_bo < iVar1; mapped_bo._0_4_ = (int)mapped_bo + 1) {
        (**(code **)(lStack_18 + 0x1680))(this->po_draw_id);
        (**(code **)(lStack_18 + 0x1258))(0,1 << ((byte)(int)mapped_bo & 0x1f));
        (**(code **)(lStack_18 + 0x538))(6,0,4);
        (**(code **)(lStack_18 + 0x5e0))(0x8c89);
        (**(code **)(lStack_18 + 0x1680))(this->po_verify_id);
        (**(code **)(lStack_18 + 0x14f0))(uVar3,iVar1);
        (**(code **)(lStack_18 + 0x14f0))(uVar4,(int)mapped_bo);
        (**(code **)(lStack_18 + 0xb8))(0x9100,this->to_2d_multisample_id);
        (**(code **)(lStack_18 + 0x30))(0);
        (**(code **)(lStack_18 + 0x538))(0,0,1);
        (**(code **)(lStack_18 + 0x638))();
        (**(code **)(lStack_18 + 0x4e8))(0x8c89);
        dVar2 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar2,"Transform feedback failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0x902);
        pfVar8 = (float *)(**(code **)(lStack_18 + 0xcf8))(0x8c8e,35000);
        dVar2 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar2,"glMapBuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0x907);
        fVar9 = *pfVar8;
        (**(code **)(lStack_18 + 0x1670))(0x8c8e);
        dVar2 = (**(code **)(lStack_18 + 0x800))();
        glu::checkError(dVar2,"glUnmapBuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                        ,0x90f);
        fVar9 = de::abs<float>(fVar9);
        if (fVar9 < 1e-05) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Value stored by verification program is zero. Test has failed.",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0x914);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      (**(code **)(lStack_18 + 0x480))(1);
      this->to_2d_multisample_id = 0;
    }
    internalformats._4_4_ = internalformats._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureFunctionalTestsSampleMaskingTexturesTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Constants */
	const glw::GLfloat epsilon		= 1e-5f;
	const glw::GLchar* fs_draw_body = "#version 310 es\n"
									  "\n"
									  "out vec4 out_color;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    out_color = vec4(1, 1, 1, 1);\n"
									  "}\n";

	const glw::GLchar* vs_draw_body = "#version 310 es\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    switch (gl_VertexID)\n"
									  "    {\n"
									  "        case 0: gl_Position = vec4(-1,  1, 0, 1); break;\n"
									  "        case 1: gl_Position = vec4( 1,  1, 0, 1); break;\n"
									  "        case 2: gl_Position = vec4( 1, -1, 0, 1); break;\n"
									  "        case 3: gl_Position = vec4(-1, -1, 0, 1); break;\n"
									  "    }\n"
									  "}\n";

	const glw::GLchar* vs_verify_body = "#version 310 es\n"
										"\n"
										"precision highp float;\n"
										"\n"
										"uniform uint              n_bit_on;\n"
										"uniform uint              n_bits;\n"
										"uniform highp sampler2DMS sampler;\n"
										"\n"
										"out float result;\n"
										"\n"
										"void main()\n"
										"{\n"
										"    vec4 one  = vec4(1);\n"
										"    vec4 zero = vec4(0);\n"
										"\n"
										"    result = 1.0;\n"
										"\n"
										"    for (uint n_current_bit = 0u; n_current_bit < n_bits; n_current_bit++)\n"
										"    {\n"
										"        vec4 value = texelFetch(sampler, ivec2(0), int(n_current_bit));\n"
										"\n"
										"        if (n_bit_on == n_current_bit)\n"
										"        {\n"
										"            if (any(notEqual(value, one)))\n"
										"            {\n"
										"                result = 0.0;\n"
										"            }\n"
										"        }\n"
										"        else\n"
										"        {\n"
										"            if (any(notEqual(value, zero)))\n"
										"            {\n"
										"                result = 0.0;\n"
										"            }\n"
										"        }\n"
										"    }\n"
										"}\n";

	/* Configure the vertex shader vs_draw_id */
	compileShader(vs_draw_id, vs_draw_body);

	/* Configure the vertex shader vs_verify_id */
	compileShader(vs_verify_id, vs_verify_body);

	/* Configure the fragment shader fs_draw_id */
	compileShader(fs_draw_id, fs_draw_body);

	/* Attach the shaders vs_draw_id and fs_draw_id to program object po_draw_id */
	gl.attachShader(po_draw_id, vs_draw_id);
	gl.attachShader(po_draw_id, fs_draw_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure po_draw_id program object");

	/* Attach the shaders vs_verify_id and fs_draw_id to program object po_verify_id */
	gl.attachShader(po_verify_id, vs_verify_id);
	gl.attachShader(po_verify_id, fs_draw_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure po_verify_id program object");

	/* Configure vs_verify_id for transform feedback - our varying of choice is result and we're happy to use either of the TF modes since we'll be outputting a single float anyway. */
	const glw::GLchar* vs_verify_varying_name = "result";

	gl.transformFeedbackVaryings(po_verify_id, 1, &vs_verify_varying_name, GL_SEPARATE_ATTRIBS);

	/* Link the program objects po_draw_id */
	linkProgram(po_draw_id);

	/* Link the program objects po_verify_id */
	linkProgram(po_verify_id);

	/* Retrieve uniform locations */
	glw::GLuint n_bits_location   = gl.getUniformLocation(po_verify_id, "n_bits");
	glw::GLuint n_bit_on_location = gl.getUniformLocation(po_verify_id, "n_bit_on");

	/* Bind the to_2d_multisample_id texture object to GL_TEXTURE_2D_MULTISAMPLE texture target */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id);

	/* Bind the fbo_id framebuffer object to GL_DRAW_FRAMEBUFFER target */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a framebuffer object");

	/* Bind the bo_id buffer object to GL_TRANSFORM_FEEDBACK_BUFFER generic target */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bo_id);

	/* Bind the bo_id buffer object to zeroth binding point of GL_TRANSFORM_FEEDBACK_BUFFER */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_id);

	/* Bind the tfo_id transform feedback object go GL_TRANSFORM_FEEDBACK target */
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfo_id);

	/* Initialize buffer object's storage to hold a total of 4 bytes (sizeof(float) );*/
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLfloat), NULL, GL_STATIC_DRAW);

	/* Attach the 2D multisample texture object to the framebuffer object's zeroth color attachment */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id,
							0); /* level */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up zeroth color attachment");

	/* Enable GL_SAMPLE_MASK mode */
	gl.enable(GL_SAMPLE_MASK);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_SAMPLE_MASK) call generated an unexpected error");

	/* Iterate through color-normalized-, color-unsigned-integer-, color-signed-integer- and depth-renderable internalformats */
	const glw::GLenum  normalized_color_internalformats[] = { GL_R8, GL_RGB565, GL_SRGB8_ALPHA8 };
	const glw::GLenum  unsigned_color_internalformats[]   = { GL_RGBA32UI, GL_RG16UI };
	const glw::GLenum  signed_color_internalformats[]	 = { GL_RGBA32I, GL_RG16I };
	const glw::GLenum  depth_internalformats[]			  = { GL_DEPTH_COMPONENT32F };
	const unsigned int n_normalized_color_internalformats =
		sizeof(normalized_color_internalformats) / sizeof(normalized_color_internalformats[0]);
	const unsigned int n_unsigned_color_internalformats =
		sizeof(unsigned_color_internalformats) / sizeof(unsigned_color_internalformats[0]);
	const unsigned int n_signed_color_internalformats =
		sizeof(signed_color_internalformats) / sizeof(signed_color_internalformats[0]);
	const unsigned int n_depth_internalformats = sizeof(depth_internalformats) / sizeof(depth_internalformats[0]);

	for (unsigned int n_iteration = 0; n_iteration < 4 /* normalized/unsigned/signed/depth */; ++n_iteration)
	{
		glw::GLenum		   attachment		 = 0;
		const glw::GLenum* internalformats   = NULL;
		unsigned int	   n_internalformats = 0;

		switch (n_iteration)
		{
		case 0:
		{
			attachment		  = GL_COLOR_ATTACHMENT0;
			internalformats   = normalized_color_internalformats;
			n_internalformats = n_normalized_color_internalformats;

			break;
		}

		case 1:
		{
			attachment		  = GL_COLOR_ATTACHMENT0;
			internalformats   = unsigned_color_internalformats;
			n_internalformats = n_unsigned_color_internalformats;

			break;
		}

		case 2:
		{
			attachment		  = GL_COLOR_ATTACHMENT0;
			internalformats   = signed_color_internalformats;
			n_internalformats = n_signed_color_internalformats;

			break;
		}

		case 3:
		{
			attachment		  = GL_DEPTH_ATTACHMENT;
			internalformats   = depth_internalformats;
			n_internalformats = n_depth_internalformats;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteration index");
		}
		} /* switch (n_iteration) */

		/* Iterate through internalformats */
		for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
		{
			glw::GLenum internalformat			   = internalformats[n_internalformat];
			glw::GLint  internalformat_max_samples = 0;

			/* Retrieve internalformat-specific GL_MAX_SAMPLES value */
			gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE,	 /* target */
								   internalformat, GL_SAMPLES, 1, /* bufSize */
								   &internalformat_max_samples);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed");

			if (internalformat_max_samples > 32)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "The test case checks only first 32 samples out of "
								   << internalformat_max_samples
								   << " reported by GL_SAMPLES reported by getInternalformativ() "
								   << "for internalformat " << internalformat << "." << tcu::TestLog::EndMessage;
			}

			/* Work with no more than 32 bits of mask's first word */
			const glw::GLint mask_bits_to_check = de::min(internalformat_max_samples, 32);

			/* Recreate to_2d_multisample_id texture object. */
			if (to_2d_multisample_id == 0)
			{
				/* Generate a 2D multisample texture object of id to_2d_multisample_id */
				gl.genTextures(1, &to_2d_multisample_id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

				if (to_2d_multisample_id == 0)
				{
					TCU_FAIL("Texture object has not been generated properly");
				}

				/* Bind the to_2d_id texture object to GL_TEXTURE_2D_MULTISAMPLE texture target */
				gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id);

				/* Attach the 2D multisample texture object to the framebuffer object's attachment */
				gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, attachment, GL_TEXTURE_2D_MULTISAMPLE,
										to_2d_multisample_id, 0); /* level */

				GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up attachment");
			}

			/* Configure the texture object storage */
			gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, internalformat_max_samples, /* samples */
									   internalformat, 1,									  /* width */
									   1,													  /* height */
									   GL_TRUE);											  /* fixedsamplelocations */

			/* Make sure no errors were reported. The framebuffer should be considered complete at this moment. */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed");

			/* For all values of n_bit from range <0, GL_MAX_SAMPLES pname value) */
			for (int n_bit = 0; n_bit < mask_bits_to_check; n_bit++)
			{
				/* Use program object po_draw_id */
				gl.useProgram(po_draw_id);

				/* Configure sample mask to only render n_bit-th sample using glSampleMaski() function */
				gl.sampleMaski(0, 1 << n_bit);

				/* Draw a triangle fan of 4 vertices. This fills to_2d_id with multisampled data.
				 * However, due to active GL_SAMPLE_MASK and the way we configured it, only one sample should have been rendered.
				 * The only way we can check if this is the case is by using a special shader,
				 * because we have no way of downloading multisampled data to process space in ES3.0+.
				 */
				gl.drawArrays(GL_TRIANGLE_FAN, 0, /* first */
							  4 /* count */);

				/* Enable GL_RASTERIZER_DISCARD mode */
				gl.enable(GL_RASTERIZER_DISCARD);
				{
					/* Use program object po_verify_id */
					gl.useProgram(po_verify_id);

					/* Specify input arguments for vertex shader */
					gl.uniform1i(n_bits_location, mask_bits_to_check);
					gl.uniform1i(n_bit_on_location, n_bit);

					/* Bind to_2d_multisample_id to GL_TEXTURE_2D_MULTISAMPLE texture target. Current texture unit is GL_TEXTURE0 */
					gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id);

					/* Begin transform feedback (primitiveMode: GL_POINTS) */
					gl.beginTransformFeedback(GL_POINTS);
					{
						/* Draw a single point. This will fill our transform feedback buffer with result */
						gl.drawArrays(GL_POINTS, 0, 1);
					}
					/* End transform feedback */
					gl.endTransformFeedback();
				}
				/* Disable GL_RASTERIZER_DISCARD mode */
				gl.disable(GL_RASTERIZER_DISCARD);

				/* Make sure no errors were generated */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Transform feedback failed");

				/* Map buffer object bo_id's contents to user-space */
				const glw::GLfloat* mapped_bo = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed");

				/* Copy result from buffer */
				glw::GLfloat result = *mapped_bo;

				/* Unmap the buffer object */
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

				/* Verify the value stored by verification program is not 0. If it is 0, the test has failed. */
				if (de::abs(result) < epsilon)
				{
					TCU_FAIL("Value stored by verification program is zero. Test has failed.");
				}
			}

			/* Delete the 2D multisample texture object with glDeleteTextures() call and re-bind the object to a GL_TEXTURE_2D_MULTISAMPLE texture target with a glBindTexture() call */
			gl.deleteTextures(1, &to_2d_multisample_id);

			to_2d_multisample_id = 0;
		} /* for (all renderable internalformats) */
	}	 /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}